

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetMnemonicWord(void *handle,void *mnemonic_handle,uint32_t index,char **mnemonic_word)

{
  undefined8 uVar1;
  CfdException *pCVar2;
  string *message;
  char *pcVar3;
  undefined8 *in_RCX;
  uint in_EDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiGetMnemonicWordList *buffer;
  string *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffee0;
  allocator local_e1;
  string *in_stack_ffffffffffffff20;
  CfdSourceLocation local_c0;
  long local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  allocator local_59;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"GetMnemonicList",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (in_RCX == (undefined8 *)0x0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x8c0;
    local_78.funcname = "CfdGetMnemonicWord";
    cfd::core::logger::warn<>(&local_78,"mnemonic_word is null.");
    local_9a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Failed to parameter. mnemonic_word is null.",&local_99);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffee0,error_code,in_stack_fffffffffffffed0);
    local_9a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(in_RSI + 0x10) != 0) {
    in_stack_fffffffffffffee0 = (CfdException *)(ulong)in_EDX;
    local_a8 = in_RSI;
    pCVar2 = (CfdException *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      **)(in_RSI + 0x10));
    if (in_stack_fffffffffffffee0 < pCVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     **)(local_a8 + 0x10),(ulong)in_EDX);
      pcVar3 = cfd::capi::CreateString(in_stack_ffffffffffffff20);
      *in_RCX = pcVar3;
      return 0;
    }
  }
  local_c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_c0.filename = local_c0.filename + 1;
  local_c0.line = 0x8c9;
  local_c0.funcname = "CfdGetMnemonicWord";
  cfd::core::logger::warn<>(&local_c0,"index is maximum over.");
  message = (string *)__cxa_allocate_exception(0x30);
  paVar4 = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff20,"Failed to parameter. index is maximum over.",paVar4
            );
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffee0,(CfdError)((ulong)paVar4 >> 0x20),message);
  __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetMnemonicWord(
    void* handle, void* mnemonic_handle, uint32_t index,
    char** mnemonic_word) {
  try {
    cfd::Initialize();
    CheckBuffer(mnemonic_handle, kPrefixGetMnemonicWordList);
    if (mnemonic_word == nullptr) {
      warn(CFD_LOG_SOURCE, "mnemonic_word is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mnemonic_word is null.");
    }

    CfdCapiGetMnemonicWordList* buffer =
        static_cast<CfdCapiGetMnemonicWordList*>(mnemonic_handle);
    if ((buffer->wordlist == nullptr) || (index >= buffer->wordlist->size())) {
      warn(CFD_LOG_SOURCE, "index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index is maximum over.");
    }

    *mnemonic_word = CreateString((*buffer->wordlist)[index]);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}